

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.h
# Opt level: O0

void __thiscall libDAI::BP::updateMessage(BP *this,size_t iI)

{
  pointer pdVar1;
  reference x;
  size_type in_RSI;
  TProb<double> *in_RDI;
  TProb<double> *in_stack_ffffffffffffff88;
  TProb<double> *in_stack_ffffffffffffffb0;
  TProb<double> *in_stack_ffffffffffffffb8;
  Real in_stack_ffffffffffffffe0;
  TProb<double> *in_stack_ffffffffffffffe8;
  
  pdVar1 = in_RDI[0xd]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((double)pdVar1 != 0.0) || (NAN((double)pdVar1))) {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0xf),in_RSI);
    TProb<double>::operator^(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x10),in_RSI);
    TProb<double>::operator^(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    TProb<double>::operator*(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0xf),in_RSI);
    TProb<double>::operator=(in_RDI,in_stack_ffffffffffffff88);
    TProb<double>::~TProb((TProb<double> *)0xb22cc0);
    TProb<double>::~TProb((TProb<double> *)0xb22cca);
    TProb<double>::~TProb((TProb<double> *)0xb22cd4);
  }
  else {
    x = std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                  ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                   (in_RDI + 0x10),in_RSI);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0xf),in_RSI);
    TProb<double>::operator=(in_RDI,x);
  }
  return;
}

Assistant:

void updateMessage(size_t iI) {
                if( Props.damping == 0.0 )
                    _messages[iI] = _newmessages[iI];
                else
                    _messages[iI] = (_messages[iI] ^ Props.damping) * (_newmessages[iI] ^ (1.0 - Props.damping));
            }